

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_buffer.cpp
# Opt level: O3

void __thiscall
duckdb::VectorStructBuffer::VectorStructBuffer
          (VectorStructBuffer *this,Vector *other,SelectionVector *sel,idx_t count)

{
  pointer puVar1;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *pvVar2;
  type other_00;
  Vector *this_00;
  pointer this_01;
  Vector *local_50;
  vector<duckdb::unique_ptr<duckdb::Vector,std::default_delete<duckdb::Vector>,true>,std::allocator<duckdb::unique_ptr<duckdb::Vector,std::default_delete<duckdb::Vector>,true>>>
  *local_48;
  VectorStructBuffer *local_40;
  idx_t local_38;
  
  local_38 = count;
  VectorBuffer::VectorBuffer(&this->super_VectorBuffer,STRUCT_BUFFER);
  (this->super_VectorBuffer)._vptr_VectorBuffer = (_func_int **)&PTR__VectorStructBuffer_02455720;
  local_48 = (vector<duckdb::unique_ptr<duckdb::Vector,std::default_delete<duckdb::Vector>,true>,std::allocator<duckdb::unique_ptr<duckdb::Vector,std::default_delete<duckdb::Vector>,true>>>
              *)&this->children;
  (this->children).
  super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->children).
  super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->children).
  super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40 = this;
  pvVar2 = StructVector::GetEntries(other);
  this_01 = (pvVar2->
            super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
            ).
            super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (pvVar2->
           super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
           ).
           super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (this_01 != puVar1) {
    do {
      other_00 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                           (this_01);
      this_00 = (Vector *)operator_new(0x68);
      Vector::Vector(this_00,other_00,sel,local_38);
      local_50 = this_00;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Vector,std::default_delete<duckdb::Vector>,true>,std::allocator<duckdb::unique_ptr<duckdb::Vector,std::default_delete<duckdb::Vector>,true>>>
      ::emplace_back<duckdb::unique_ptr<duckdb::Vector,std::default_delete<duckdb::Vector>,true>>
                (local_48,(unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                          &local_50);
      if (local_50 != (Vector *)0x0) {
        ::std::default_delete<duckdb::Vector>::operator()
                  ((default_delete<duckdb::Vector> *)&local_50,local_50);
      }
      this_01 = this_01 + 1;
    } while (this_01 != puVar1);
  }
  return;
}

Assistant:

VectorStructBuffer::VectorStructBuffer(Vector &other, const SelectionVector &sel, idx_t count)
    : VectorBuffer(VectorBufferType::STRUCT_BUFFER) {
	auto &other_vector = StructVector::GetEntries(other);
	for (auto &child_vector : other_vector) {
		auto vector = make_uniq<Vector>(*child_vector, sel, count);
		children.push_back(std::move(vector));
	}
}